

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_ecdsa_edge_cases(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  secp256k1_context *psVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  uchar *noncedata;
  uint64_t *puVar10;
  secp256k1_gej *psVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int32_t _calls_to_callback_9;
  secp256k1_scalar sr;
  secp256k1_scalar ss;
  secp256k1_scalar ss_3;
  secp256k1_scalar msg;
  size_t siglen;
  secp256k1_ecdsa_signature sig;
  secp256k1_gej keyj;
  uint64_t local_2038 [1025];
  
  secp256k1_scalar_set_int(&ss,1);
  secp256k1_scalar_negate(&ss,&ss);
  secp256k1_scalar_inverse(&ss,&ss);
  secp256k1_scalar_set_int(&sr,1);
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&keyj,&sr);
  secp256k1_ge_set_gej((secp256k1_ge *)&sig,&keyj);
  msg.d[2] = ss.d[2];
  msg.d[3] = ss.d[3];
  msg.d[0] = ss.d[0];
  msg.d[1] = ss.d[1];
  iVar7 = secp256k1_ecdsa_sig_verify(&sr,&ss,(secp256k1_ge *)&sig,&msg);
  if (iVar7 == 0) {
    secp256k1_scalar_set_int(&sr,1);
    secp256k1_scalar_set_int((secp256k1_scalar *)&sig,0);
    secp256k1_scalar_set_int(&msg,0);
    iVar7 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)&keyj,&DAT_0015f8d0,0x21);
    if (iVar7 == 0) {
      pcVar12 = "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33)";
      uVar9 = 0x1bb1;
    }
    else {
      iVar7 = secp256k1_ecdsa_sig_verify(&msg,&sr,(secp256k1_ge *)&keyj,(secp256k1_scalar *)&sig);
      if (iVar7 == 0) {
        sig.data[0x10] = '\0';
        sig.data[0x11] = '\0';
        sig.data[0x12] = '\0';
        sig.data[0x13] = '\0';
        sig.data[0x14] = '\0';
        sig.data[0x15] = '\0';
        sig.data[0x16] = '\0';
        sig.data[0x17] = '\0';
        sig.data[0x18] = '\0';
        sig.data[0x19] = '\0';
        sig.data[0x1a] = '\0';
        sig.data[0x1b] = '\0';
        sig.data[0x1c] = '\0';
        sig.data[0x1d] = '\0';
        sig.data[0x1e] = '\0';
        sig.data[0x1f] = '\0';
        sig.data._1_15_ = SUB1615((undefined1  [16])0x0,1);
        sig.data[0] = '\x02';
        sig.data[0x20] = '\x01';
        secp256k1_scalar_set_int(&ss,0);
        secp256k1_scalar_set_int(&msg,0);
        secp256k1_scalar_set_int(&sr,1);
        iVar7 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)&keyj,sig.data,0x21);
        if (iVar7 == 0) {
          pcVar12 = "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)";
          uVar9 = 0x1bc4;
        }
        else {
          iVar7 = secp256k1_ecdsa_sig_verify(&sr,&ss,(secp256k1_ge *)&keyj,&msg);
          if (iVar7 == 0) {
            msg.d[2] = 0;
            msg.d[3] = 0;
            msg.d._1_15_ = SUB1615((undefined1  [16])0x0,1);
            msg.d[0]._0_1_ = 2;
            secp256k1_scalar_set_int(&ss_3,2);
            secp256k1_scalar_set_int(&sr,0);
            secp256k1_scalar_set_int(&ss,2);
            iVar7 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)&keyj,(uchar *)&msg,0x21);
            if (iVar7 == 0) {
              pcVar12 = "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)";
              uVar9 = 0x1bdf;
            }
            else {
              iVar7 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)&sig,&DAT_0015f900,0x21);
              if (iVar7 == 0) {
                pcVar12 = "test condition failed: secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33)";
                uVar9 = 0x1be0;
              }
              else {
                iVar7 = secp256k1_ecdsa_sig_verify(&ss,&ss_3,(secp256k1_ge *)&keyj,&sr);
                if (iVar7 == 0) {
                  pcVar12 = 
                  "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1";
                  uVar9 = 0x1be1;
                }
                else {
                  iVar7 = secp256k1_ecdsa_sig_verify(&ss,&ss_3,(secp256k1_ge *)&sig,&sr);
                  if (iVar7 == 0) {
                    pcVar12 = 
                    "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1";
                    uVar9 = 0x1be2;
                  }
                  else {
                    secp256k1_scalar_negate(&ss_3,&ss_3);
                    iVar7 = secp256k1_ecdsa_sig_verify(&ss,&ss_3,(secp256k1_ge *)&keyj,&sr);
                    if (iVar7 == 0) {
                      pcVar12 = 
                      "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1"
                      ;
                      uVar9 = 0x1be4;
                    }
                    else {
                      iVar7 = secp256k1_ecdsa_sig_verify(&ss,&ss_3,(secp256k1_ge *)&sig,&sr);
                      if (iVar7 == 0) {
                        pcVar12 = 
                        "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1"
                        ;
                        uVar9 = 0x1be5;
                      }
                      else {
                        secp256k1_scalar_set_int(&ss_3,1);
                        iVar7 = secp256k1_ecdsa_sig_verify(&ss,&ss_3,(secp256k1_ge *)&keyj,&sr);
                        if (iVar7 == 0) {
                          iVar7 = secp256k1_ecdsa_sig_verify(&ss,&ss_3,(secp256k1_ge *)&sig,&sr);
                          if (iVar7 == 0) {
                            secp256k1_scalar_set_int(&ss,1);
                            secp256k1_scalar_set_int(&msg,1);
                            secp256k1_scalar_set_b32(&sr,"",(int *)0x0);
                            iVar7 = secp256k1_eckey_pubkey_parse
                                              ((secp256k1_ge *)&keyj,&DAT_0015f930,0x21);
                            if (iVar7 == 0) {
                              pcVar12 = 
                              "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)"
                              ;
                              uVar9 = 0x1c08;
                            }
                            else {
                              iVar7 = secp256k1_eckey_pubkey_parse
                                                ((secp256k1_ge *)&sig,&DAT_0015f960,0x21);
                              if (iVar7 == 0) {
                                pcVar12 = 
                                "test condition failed: secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33)"
                                ;
                                uVar9 = 0x1c09;
                              }
                              else {
                                iVar7 = secp256k1_ecdsa_sig_verify
                                                  (&sr,&ss,(secp256k1_ge *)&keyj,&msg);
                                if (iVar7 == 0) {
                                  pcVar12 = 
                                  "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1"
                                  ;
                                  uVar9 = 0x1c0a;
                                }
                                else {
                                  iVar7 = secp256k1_ecdsa_sig_verify
                                                    (&sr,&ss,(secp256k1_ge *)&sig,&msg);
                                  if (iVar7 == 0) {
                                    pcVar12 = 
                                    "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1"
                                    ;
                                    uVar9 = 0x1c0b;
                                  }
                                  else {
                                    secp256k1_scalar_negate(&ss,&ss);
                                    iVar7 = secp256k1_ecdsa_sig_verify
                                                      (&sr,&ss,(secp256k1_ge *)&keyj,&msg);
                                    if (iVar7 == 0) {
                                      pcVar12 = 
                                      "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1"
                                      ;
                                      uVar9 = 0x1c0d;
                                    }
                                    else {
                                      iVar7 = secp256k1_ecdsa_sig_verify
                                                        (&sr,&ss,(secp256k1_ge *)&sig,&msg);
                                      if (iVar7 == 0) {
                                        pcVar12 = 
                                        "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1"
                                        ;
                                        uVar9 = 0x1c0e;
                                      }
                                      else {
                                        secp256k1_scalar_set_int(&ss,2);
                                        secp256k1_scalar_inverse_var(&ss,&ss);
                                        iVar7 = secp256k1_ecdsa_sig_verify
                                                          (&sr,&ss,(secp256k1_ge *)&keyj,&msg);
                                        if (iVar7 == 0) {
                                          iVar7 = secp256k1_ecdsa_sig_verify
                                                            (&sr,&ss,(secp256k1_ge *)&sig,&msg);
                                          if (iVar7 == 0) {
                                            secp256k1_scalar_set_int(&sr,1);
                                            secp256k1_scalar_set_int((secp256k1_scalar *)&sig,1);
                                            secp256k1_scalar_negate
                                                      ((secp256k1_scalar *)&sig,
                                                       (secp256k1_scalar *)&sig);
                                            secp256k1_scalar_set_b32(&msg,"",(int *)0x0);
                                            iVar7 = secp256k1_eckey_pubkey_parse
                                                              ((secp256k1_ge *)&keyj,&DAT_0015f990,
                                                               0x21);
                                            if (iVar7 == 0) {
                                              pcVar12 = 
                                              "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)"
                                              ;
                                              uVar9 = 0x1c2b;
                                            }
                                            else {
                                              iVar7 = secp256k1_ecdsa_sig_verify
                                                                (&msg,&sr,(secp256k1_ge *)&keyj,
                                                                 (secp256k1_scalar *)&sig);
                                              if (iVar7 == 0) {
                                                pcVar12 = 
                                                "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1"
                                                ;
                                                uVar9 = 0x1c2c;
                                              }
                                              else {
                                                secp256k1_scalar_negate(&sr,&sr);
                                                iVar7 = secp256k1_ecdsa_sig_verify
                                                                  (&msg,&sr,(secp256k1_ge *)&keyj,
                                                                   (secp256k1_scalar *)&sig);
                                                if (iVar7 == 0) {
                                                  pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1"
                                                  ;
                                                  uVar9 = 0x1c2e;
                                                }
                                                else {
                                                  secp256k1_scalar_set_int(&sr,3);
                                                  secp256k1_scalar_inverse_var(&sr,&sr);
                                                  iVar7 = secp256k1_ecdsa_sig_verify
                                                                    (&msg,&sr,(secp256k1_ge *)&keyj,
                                                                     (secp256k1_scalar *)&sig);
                                                  if (iVar7 == 0) {
                                                    sr.d._16_16_ = ZEXT816(0x100000000000000) <<
                                                                   0x40;
                                                    sr.d._0_16_ = ZEXT816(0);
                                                    ss.d[3] = 0xa9293eb931dddf65;
                                                    ss.d[2] = 0x62777a810be012b8;
                                                    ss.d[1] = 0xf7f478316a9d5faa;
                                                    ss.d[0] = 0x5344230681994186;
                                                    iVar7 = secp256k1_ecdsa_sign
                                                                      (CTX,&sig,(uchar *)&ss,
                                                                       (uchar *)&sr,
                                                                       precomputed_nonce_function,""
                                                                      );
                                                    if (iVar7 == 0) {
                                                      iVar7 = secp256k1_ecdsa_sign
                                                                        (CTX,&sig,(uchar *)&ss,
                                                                         (uchar *)&sr,
                                                                         precomputed_nonce_function,
                                                                         test_ecdsa_edge_cases::
                                                                         nonce2);
                                                      if (iVar7 == 0) {
                                                        ss.d[3]._7_1_ = 0xaa;
                                                        iVar7 = secp256k1_ecdsa_sign
                                                                          (CTX,&sig,(uchar *)&ss,
                                                                           (uchar *)&sr,
                                                                                                                                                      
                                                  precomputed_nonce_function,"");
                                                  if (iVar7 == 1) {
                                                    auVar1._12_4_ = 0;
                                                    auVar1._0_12_ = (undefined1  [12])msg.d._4_12_;
                                                    msg.d._0_16_ = auVar1 << 0x20;
                                                    keyj.x.n[0] = (uint64_t)
                                                                  (CTX->illegal_callback).fn;
                                                    keyj.x.n[1] = (uint64_t)
                                                                  (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&msg);
                                                    iVar7 = secp256k1_ecdsa_sign
                                                                      (CTX,(
                                                  secp256k1_ecdsa_signature *)0x0,(uchar *)&ss,
                                                  (uchar *)&sr,precomputed_nonce_function,
                                                  test_ecdsa_edge_cases::nonce2);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)keyj.x.n[0]
                                                    ;
                                                    (psVar6->illegal_callback).data =
                                                         (void *)keyj.x.n[1];
                                                    if ((int)msg.d[0] == 1) {
                                                      auVar2._12_4_ = 0;
                                                      auVar2._0_12_ = (undefined1  [12])msg.d._4_12_
                                                      ;
                                                      msg.d._0_16_ = auVar2 << 0x20;
                                                      keyj.x.n[0] = (uint64_t)
                                                                    (psVar6->illegal_callback).fn;
                                                      keyj.x.n[1] = (uint64_t)
                                                                    (psVar6->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar6,counting_callback_fn,&msg);
                                                      iVar7 = secp256k1_ecdsa_sign
                                                                        (CTX,&sig,(uchar *)0x0,
                                                                         (uchar *)&sr,
                                                                         precomputed_nonce_function,
                                                                         test_ecdsa_edge_cases::
                                                                         nonce2);
                                                      psVar6 = CTX;
                                                      if (iVar7 == 0) {
                                                        (CTX->illegal_callback).fn =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             keyj.x.n[0];
                                                        (psVar6->illegal_callback).data =
                                                             (void *)keyj.x.n[1];
                                                        if ((int)msg.d[0] == 1) {
                                                          auVar3._12_4_ = 0;
                                                          auVar3._0_12_ =
                                                               (undefined1  [12])msg.d._4_12_;
                                                          msg.d._0_16_ = auVar3 << 0x20;
                                                          keyj.x.n[0] = (uint64_t)
                                                                        (psVar6->illegal_callback).
                                                                        fn;
                                                          keyj.x.n[1] = (uint64_t)
                                                                        (psVar6->illegal_callback).
                                                                        data;
                                                          secp256k1_context_set_illegal_callback
                                                                    (psVar6,counting_callback_fn,
                                                                     &msg);
                                                          iVar7 = secp256k1_ecdsa_sign
                                                                            (CTX,&sig,(uchar *)&ss,
                                                                             (uchar *)0x0,
                                                                                                                                                          
                                                  precomputed_nonce_function,
                                                  test_ecdsa_edge_cases::nonce2);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)keyj.x.n[0]
                                                    ;
                                                    (psVar6->illegal_callback).data =
                                                         (void *)keyj.x.n[1];
                                                    if ((int)msg.d[0] == 1) {
                                                      iVar7 = secp256k1_ecdsa_sign
                                                                        (psVar6,&sig,(uchar *)&ss,
                                                                         (uchar *)&sr,
                                                                         precomputed_nonce_function,
                                                                         test_ecdsa_edge_cases::
                                                                         nonce2);
                                                      if (iVar7 == 1) {
                                                        iVar7 = secp256k1_ec_pubkey_create
                                                                          (CTX,(secp256k1_pubkey *)
                                                                               &msg,(uchar *)&sr);
                                                        if (iVar7 == 0) {
                                                          pcVar12 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1"
                                                  ;
                                                  uVar9 = 0x1c59;
                                                  }
                                                  else {
                                                    ss_3.d[0] = ss_3.d[0] & 0xffffffff00000000;
                                                    keyj.x.n[0] = (uint64_t)
                                                                  (CTX->illegal_callback).fn;
                                                    keyj.x.n[1] = (uint64_t)
                                                                  (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&ss_3);
                                                    iVar7 = secp256k1_ecdsa_verify
                                                                      (CTX,(
                                                  secp256k1_ecdsa_signature *)0x0,(uchar *)&ss,
                                                  (secp256k1_pubkey *)&msg);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)keyj.x.n[0]
                                                    ;
                                                    (psVar6->illegal_callback).data =
                                                         (void *)keyj.x.n[1];
                                                    if ((int)ss_3.d[0] == 1) {
                                                      ss_3.d[0] = ss_3.d[0] & 0xffffffff00000000;
                                                      keyj.x.n[0] = (uint64_t)
                                                                    (psVar6->illegal_callback).fn;
                                                      keyj.x.n[1] = (uint64_t)
                                                                    (psVar6->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar6,counting_callback_fn,&ss_3);
                                                      iVar7 = secp256k1_ecdsa_verify
                                                                        (CTX,&sig,(uchar *)0x0,
                                                                         (secp256k1_pubkey *)&msg);
                                                      psVar6 = CTX;
                                                      if (iVar7 == 0) {
                                                        (CTX->illegal_callback).fn =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             keyj.x.n[0];
                                                        (psVar6->illegal_callback).data =
                                                             (void *)keyj.x.n[1];
                                                        if ((int)ss_3.d[0] == 1) {
                                                          ss_3.d[0] = ss_3.d[0] & 0xffffffff00000000
                                                          ;
                                                          keyj.x.n[0] = (uint64_t)
                                                                        (psVar6->illegal_callback).
                                                                        fn;
                                                          keyj.x.n[1] = (uint64_t)
                                                                        (psVar6->illegal_callback).
                                                                        data;
                                                          secp256k1_context_set_illegal_callback
                                                                    (psVar6,counting_callback_fn,
                                                                     &ss_3);
                                                          iVar7 = secp256k1_ecdsa_verify
                                                                            (CTX,&sig,(uchar *)&ss,
                                                                             (secp256k1_pubkey *)0x0
                                                                            );
                                                          psVar6 = CTX;
                                                          if (iVar7 == 0) {
                                                            (CTX->illegal_callback).fn =
                                                                 (_func_void_char_ptr_void_ptr *)
                                                                 keyj.x.n[0];
                                                            (psVar6->illegal_callback).data =
                                                                 (void *)keyj.x.n[1];
                                                            if ((int)ss_3.d[0] == 1) {
                                                              iVar7 = secp256k1_ecdsa_verify
                                                                                (psVar6,&sig,
                                                                                 (uchar *)&ss,
                                                                                 (secp256k1_pubkey *
                                                                                 )&msg);
                                                              if (iVar7 == 0) {
                                                                pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1"
                                                  ;
                                                  uVar9 = 0x1c5d;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  ss_3.d[0] = ss_3.d[0] & 0xffffffff00000000;
                                                  keyj.x.n[0] = (uint64_t)(CTX->illegal_callback).fn
                                                  ;
                                                  keyj.x.n[1] = (uint64_t)
                                                                (CTX->illegal_callback).data;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,&ss_3);
                                                  iVar7 = secp256k1_ec_pubkey_create
                                                                    (CTX,(secp256k1_pubkey *)&msg,
                                                                     (uchar *)0x0);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)keyj.x.n[0]
                                                    ;
                                                    (psVar6->illegal_callback).data =
                                                         (void *)keyj.x.n[1];
                                                    if ((int)ss_3.d[0] == 1) {
                                                      ss_3.d[0] = ss_3.d[0] & 0xffffffff00000000;
                                                      keyj.x.n[0] = (uint64_t)
                                                                    (psVar6->illegal_callback).fn;
                                                      keyj.x.n[1] = (uint64_t)
                                                                    (psVar6->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar6,counting_callback_fn,&ss_3);
                                                      iVar7 = secp256k1_ecdsa_verify
                                                                        (CTX,&sig,(uchar *)&ss,
                                                                         (secp256k1_pubkey *)&msg);
                                                      psVar6 = CTX;
                                                      if (iVar7 == 0) {
                                                        (CTX->illegal_callback).fn =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             keyj.x.n[0];
                                                        (psVar6->illegal_callback).data =
                                                             (void *)keyj.x.n[1];
                                                        if ((int)ss_3.d[0] == 1) {
                                                          ss_3.d[0] = ss_3.d[0] & 0xffffffff00000000
                                                          ;
                                                          siglen = 0x48;
                                                          keyj.x.n[0] = (uint64_t)
                                                                        (psVar6->illegal_callback).
                                                                        fn;
                                                          keyj.x.n[1] = (uint64_t)
                                                                        (psVar6->illegal_callback).
                                                                        data;
                                                          secp256k1_context_set_illegal_callback
                                                                    (psVar6,counting_callback_fn,
                                                                     &ss_3);
                                                          iVar7 = 
                                                  secp256k1_ecdsa_signature_serialize_der
                                                            (CTX,(uchar *)0x0,&siglen,&sig);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)keyj.x.n[0]
                                                    ;
                                                    (psVar6->illegal_callback).data =
                                                         (void *)keyj.x.n[1];
                                                    if ((int)ss_3.d[0] == 1) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_3.d[0] = (uint64_t)
                                                                  (psVar6->illegal_callback).fn;
                                                      ss_3.d[1] = (uint64_t)
                                                                  (psVar6->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar6,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      iVar7 = 
                                                  secp256k1_ecdsa_signature_serialize_der
                                                            (CTX,(uchar *)&keyj,(size_t *)0x0,&sig);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_3.d[0];
                                                    (psVar6->illegal_callback).data =
                                                         (void *)ss_3.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_3.d[0] = (uint64_t)
                                                                  (psVar6->illegal_callback).fn;
                                                      ss_3.d[1] = (uint64_t)
                                                                  (psVar6->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar6,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      iVar7 = 
                                                  secp256k1_ecdsa_signature_serialize_der
                                                            (CTX,(uchar *)&keyj,&siglen,
                                                             (secp256k1_ecdsa_signature *)0x0);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_3.d[0];
                                                    (psVar6->illegal_callback).data =
                                                         (void *)ss_3.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      iVar7 = 
                                                  secp256k1_ecdsa_signature_serialize_der
                                                            (psVar6,(uchar *)&keyj,&siglen,&sig);
                                                  if (iVar7 == 0) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1"
                                                  ;
                                                  uVar9 = 0x1c65;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  __calls_to_callback_9 =
                                                       __calls_to_callback_9 & 0xffffffff00000000;
                                                  ss_3.d[0] = (uint64_t)(CTX->illegal_callback).fn;
                                                  ss_3.d[1] = (uint64_t)(CTX->illegal_callback).data
                                                  ;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,
                                                             &_calls_to_callback_9);
                                                  iVar7 = secp256k1_ecdsa_signature_parse_der
                                                                    (CTX,(secp256k1_ecdsa_signature
                                                                          *)0x0,(uchar *)&keyj,
                                                                     siglen);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_3.d[0];
                                                    (psVar6->illegal_callback).data =
                                                         (void *)ss_3.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_3.d[0] = (uint64_t)
                                                                  (psVar6->illegal_callback).fn;
                                                      ss_3.d[1] = (uint64_t)
                                                                  (psVar6->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar6,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      iVar7 = secp256k1_ecdsa_signature_parse_der
                                                                        (CTX,&sig,(uchar *)0x0,
                                                                         siglen);
                                                      psVar6 = CTX;
                                                      if (iVar7 == 0) {
                                                        (CTX->illegal_callback).fn =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             ss_3.d[0];
                                                        (psVar6->illegal_callback).data =
                                                             (void *)ss_3.d[1];
                                                        if (_calls_to_callback_9 == 1) {
                                                          iVar7 = 
                                                  secp256k1_ecdsa_signature_parse_der
                                                            (psVar6,&sig,(uchar *)&keyj,siglen);
                                                  if (iVar7 == 0) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1"
                                                  ;
                                                  uVar9 = 0x1c68;
                                                  }
                                                  else {
                                                    siglen = 10;
                                                    iVar7 = secp256k1_ecdsa_signature_serialize_der
                                                                      (CTX,(uchar *)&keyj,&siglen,
                                                                       &sig);
                                                    if (iVar7 == 0) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_3.d[0] = (uint64_t)
                                                                  (CTX->illegal_callback).fn;
                                                      ss_3.d[1] = (uint64_t)
                                                                  (CTX->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (CTX,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      iVar7 = secp256k1_ecdsa_signature_normalize
                                                                        (CTX,(
                                                  secp256k1_ecdsa_signature *)0x0,
                                                  (secp256k1_ecdsa_signature *)0x0);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_3.d[0];
                                                    (psVar6->illegal_callback).data =
                                                         (void *)ss_3.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_3.d[0] = (uint64_t)
                                                                  (psVar6->illegal_callback).fn;
                                                      ss_3.d[1] = (uint64_t)
                                                                  (psVar6->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar6,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      iVar7 = 
                                                  secp256k1_ecdsa_signature_serialize_compact
                                                            (CTX,(uchar *)0x0,&sig);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_3.d[0];
                                                    (psVar6->illegal_callback).data =
                                                         (void *)ss_3.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_3.d[0] = (uint64_t)
                                                                  (psVar6->illegal_callback).fn;
                                                      ss_3.d[1] = (uint64_t)
                                                                  (psVar6->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar6,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      iVar7 = 
                                                  secp256k1_ecdsa_signature_serialize_compact
                                                            (CTX,(uchar *)&keyj,
                                                             (secp256k1_ecdsa_signature *)0x0);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_3.d[0];
                                                    (psVar6->illegal_callback).data =
                                                         (void *)ss_3.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      iVar7 = 
                                                  secp256k1_ecdsa_signature_serialize_compact
                                                            (psVar6,(uchar *)&keyj,&sig);
                                                  if (iVar7 == 0) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1"
                                                  ;
                                                  uVar9 = 0x1c6f;
                                                  }
                                                  else {
                                                    __calls_to_callback_9 =
                                                         __calls_to_callback_9 & 0xffffffff00000000;
                                                    ss_3.d[0] = (uint64_t)(CTX->illegal_callback).fn
                                                    ;
                                                    ss_3.d[1] = (uint64_t)
                                                                (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &_calls_to_callback_9);
                                                    iVar7 = secp256k1_ecdsa_signature_parse_compact
                                                                      (CTX,(
                                                  secp256k1_ecdsa_signature *)0x0,(uchar *)&keyj);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_3.d[0];
                                                    (psVar6->illegal_callback).data =
                                                         (void *)ss_3.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_3.d[0] = (uint64_t)
                                                                  (psVar6->illegal_callback).fn;
                                                      ss_3.d[1] = (uint64_t)
                                                                  (psVar6->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar6,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      iVar7 = 
                                                  secp256k1_ecdsa_signature_parse_compact
                                                            (CTX,&sig,(uchar *)0x0);
                                                  psVar6 = CTX;
                                                  if (iVar7 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_3.d[0];
                                                    (psVar6->illegal_callback).data =
                                                         (void *)ss_3.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      iVar7 = 
                                                  secp256k1_ecdsa_signature_parse_compact
                                                            (psVar6,&sig,(uchar *)&keyj);
                                                  if (iVar7 == 0) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1"
                                                  ;
                                                  uVar9 = 0x1c72;
                                                  }
                                                  else {
                                                    keyj.y.n[0]._0_4_ = 0xffffffff;
                                                    keyj.y.n[0]._4_4_ = 0xffffffff;
                                                    keyj.y.n[1]._0_4_ = 0xffffffff;
                                                    keyj.y.n[1]._4_4_ = 0xffffffff;
                                                    keyj.x.n[4] = 0xffffffffffffffff;
                                                    keyj.x.magnitude = -1;
                                                    keyj.x.normalized = -1;
                                                    keyj.x.n[2] = 0xffffffffffffffff;
                                                    keyj.x.n[3] = 0xffffffffffffffff;
                                                    keyj.x.n[0] = 0xffffffffffffffff;
                                                    keyj.x.n[1] = 0xffffffffffffffff;
                                                    iVar7 = secp256k1_ecdsa_signature_parse_compact
                                                                      (CTX,&sig,(uchar *)&keyj);
                                                    if (iVar7 == 0) {
                                                      iVar7 = 0;
                                                      while( true ) {
                                                        if (iVar7 == 2) break;
                                                        noncedata = "";
                                                        if (iVar7 == 0) {
                                                          noncedata = (uchar *)0x0;
                                                        }
                                                        ss.d[0] = 0;
                                                        ss.d[1] = 0;
                                                        ss.d._16_15_ = SUB1615((undefined1  [16])0x0
                                                                               ,0);
                                                        ss.d[3]._7_1_ = 1;
                                                        sr.d[1]._0_4_ = 0xffffffff;
                                                        sr.d[0] = 0xffffffffffffffff;
                                                        sr.d[1]._4_4_ = 0xffffffff;
                                                        sr.d[3]._0_4_ = 0xffffffff;
                                                        sr.d[2] = 0xffffffffffffffff;
                                                        sr.d[3]._4_4_ = 0xffffffff;
                                                        iVar8 = secp256k1_ecdsa_sign
                                                                          (CTX,&sig,(uchar *)&ss,
                                                                           (uchar *)&sr,
                                                                           (secp256k1_nonce_function
                                                                           )0x0,noncedata);
                                                        if (iVar8 != 0) {
                                                          pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0"
                                                  ;
                                                  uVar9 = 0x1c85;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = is_empty_signature(&sig);
                                                  if (iVar8 == 0) {
                                                    pcVar12 = 
                                                  "test condition failed: is_empty_signature(&sig)";
                                                  uVar9 = 0x1c86;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  sr.d[2] = 0;
                                                  sr.d[3] = 0;
                                                  sr.d[0] = 0;
                                                  sr.d[1] = 0;
                                                  iVar8 = secp256k1_ecdsa_sign
                                                                    (CTX,&sig,(uchar *)&ss,
                                                                     (uchar *)&sr,
                                                                     (secp256k1_nonce_function)0x0,
                                                                     noncedata);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0"
                                                  ;
                                                  uVar9 = 0x1c89;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = is_empty_signature(&sig);
                                                  if (iVar8 == 0) {
                                                    pcVar12 = 
                                                  "test condition failed: is_empty_signature(&sig)";
                                                  uVar9 = 0x1c8a;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  sr.d[3]._7_1_ = 1;
                                                  iVar8 = secp256k1_ecdsa_sign
                                                                    (CTX,&sig,(uchar *)&ss,
                                                                     (uchar *)&sr,
                                                                     nonce_function_test_fail,
                                                                     noncedata);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0"
                                                  ;
                                                  uVar9 = 0x1c8d;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = is_empty_signature(&sig);
                                                  if (iVar8 == 0) {
                                                    pcVar12 = 
                                                  "test condition failed: is_empty_signature(&sig)";
                                                  uVar9 = 0x1c8e;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = secp256k1_ecdsa_sign
                                                                    (CTX,&sig,(uchar *)&ss,
                                                                     (uchar *)&sr,
                                                                     nonce_function_test_retry,
                                                                     noncedata);
                                                  if (iVar8 != 1) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1"
                                                  ;
                                                  uVar9 = 0x1c90;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = is_empty_signature(&sig);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: !is_empty_signature(&sig)"
                                                  ;
                                                  uVar9 = 0x1c91;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = secp256k1_ecdsa_sign
                                                                    (CTX,(secp256k1_ecdsa_signature
                                                                          *)&msg,(uchar *)&ss,
                                                                     (uchar *)&sr,
                                                                     nonce_function_rfc6979,
                                                                     noncedata);
                                                  if (iVar8 != 1) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1"
                                                  ;
                                                  uVar9 = 0x1c92;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = is_empty_signature((
                                                  secp256k1_ecdsa_signature *)&msg);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: !is_empty_signature(&sig2)"
                                                  ;
                                                  uVar9 = 0x1c93;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = secp256k1_memcmp_var
                                                                    (&sig,(secp256k1_ecdsa_signature
                                                                           *)&msg,0x40);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0"
                                                  ;
                                                  uVar9 = 0x1c94;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = secp256k1_ecdsa_sign
                                                                    (CTX,(secp256k1_ecdsa_signature
                                                                          *)&msg,(uchar *)&ss,
                                                                     (uchar *)&sr,
                                                                     (secp256k1_nonce_function)0x0,
                                                                     noncedata);
                                                  if (iVar8 != 1) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1"
                                                  ;
                                                  uVar9 = 0x1c96;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = is_empty_signature((
                                                  secp256k1_ecdsa_signature *)&msg);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: !is_empty_signature(&sig2)"
                                                  ;
                                                  uVar9 = 0x1c97;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = secp256k1_memcmp_var
                                                                    (&sig,(secp256k1_ecdsa_signature
                                                                           *)&msg,0x40);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0"
                                                  ;
                                                  uVar9 = 0x1c98;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  lVar14 = 1;
                                                  for (lVar13 = 0; lVar13 != 0x100;
                                                      lVar13 = lVar13 + 1) {
                                                    ss.d[0]._0_1_ = (char)lVar13;
                                                    iVar8 = secp256k1_ecdsa_sign
                                                                      (CTX,(
                                                  secp256k1_ecdsa_signature *)&msg,(uchar *)&ss,
                                                  (uchar *)&sr,(secp256k1_nonce_function)0x0,
                                                  noncedata);
                                                  if (iVar8 != 1) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1"
                                                  ;
                                                  uVar9 = 0x1c9d;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = is_empty_signature((
                                                  secp256k1_ecdsa_signature *)&msg);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: !is_empty_signature(&sig2)"
                                                  ;
                                                  uVar9 = 0x1c9e;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  puVar10 = keyj.x.n + lVar13 * 4;
                                                  keyj.x.n[lVar13 * 4 + 2] = msg.d[2];
                                                  keyj.x.n[lVar13 * 4 + 3] = msg.d[3];
                                                  *puVar10 = msg.d[0];
                                                  keyj.x.n[lVar13 * 4 + 1] = msg.d[1];
                                                  psVar11 = &keyj;
                                                  lVar15 = lVar14;
                                                  while (lVar15 = lVar15 + -1, lVar15 != 0) {
                                                    iVar8 = secp256k1_scalar_eq((secp256k1_scalar *)
                                                                                puVar10,(
                                                  secp256k1_scalar *)psVar11);
                                                  psVar11 = (secp256k1_gej *)((psVar11->x).n + 4);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: !secp256k1_scalar_eq(&sr[i], &sr[j])"
                                                  ;
                                                  uVar9 = 0x1ca1;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  }
                                                  lVar14 = lVar14 + 1;
                                                  }
                                                  auVar4[0xf] = 0;
                                                  auVar4._0_15_ = (undefined1  [15])ss.d._1_15_;
                                                  ss.d._0_16_ = auVar4 << 8;
                                                  ss.d[3]._7_1_ = 2;
                                                  lVar14 = 0x101;
                                                  for (lVar13 = 0x100; lVar13 != 0x200;
                                                      lVar13 = lVar13 + 1) {
                                                    sr.d[0]._0_1_ = (char)lVar13;
                                                    iVar8 = secp256k1_ecdsa_sign
                                                                      (CTX,(
                                                  secp256k1_ecdsa_signature *)&msg,(uchar *)&ss,
                                                  (uchar *)&sr,(secp256k1_nonce_function)0x0,
                                                  noncedata);
                                                  if (iVar8 != 1) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1"
                                                  ;
                                                  uVar9 = 0x1caa;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  iVar8 = is_empty_signature((
                                                  secp256k1_ecdsa_signature *)&msg);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: !is_empty_signature(&sig2)"
                                                  ;
                                                  uVar9 = 0x1cab;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  puVar10 = keyj.x.n + lVar13 * 4;
                                                  keyj.x.n[lVar13 * 4 + 2] = msg.d[2];
                                                  keyj.x.n[lVar13 * 4 + 3] = msg.d[3];
                                                  *puVar10 = msg.d[0];
                                                  keyj.x.n[lVar13 * 4 + 1] = msg.d[1];
                                                  psVar11 = &keyj;
                                                  lVar15 = lVar14;
                                                  while (lVar15 = lVar15 + -1, lVar15 != 0) {
                                                    iVar8 = secp256k1_scalar_eq((secp256k1_scalar *)
                                                                                puVar10,(
                                                  secp256k1_scalar *)psVar11);
                                                  psVar11 = (secp256k1_gej *)((psVar11->x).n + 4);
                                                  if (iVar8 != 0) {
                                                    pcVar12 = 
                                                  "test condition failed: !secp256k1_scalar_eq(&sr[i], &sr[j])"
                                                  ;
                                                  uVar9 = 0x1cae;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  }
                                                  lVar14 = lVar14 + 1;
                                                  }
                                                  iVar7 = iVar7 + 1;
                                                  }
                                                  msg.d[2] = 0;
                                                  msg.d[3] = 0;
                                                  msg.d[0] = 0;
                                                  msg.d[1] = 0;
                                                  auVar5._8_8_ = 0;
                                                  auVar5._0_8_ = ss.d[1];
                                                  ss.d._0_16_ = auVar5 << 0x40;
                                                  ss_3.d[0] = 0;
                                                  siglen = 0;
                                                  keyj.x.n[0] = 0x4d430001;
                                                  keyj.x.n[1] = (uint64_t)&siglen;
                                                  keyj.x.n[2] = 0x20;
                                                  keyj.x.n[3] = 0;
                                                  keyj.x.n[4] = 0;
                                                  keyj.x.magnitude = 0;
                                                  keyj.x.normalized = 0;
                                                  __calls_to_callback_9 = 0;
                                                  nonce_function_rfc6979
                                                            ((uchar *)&sr,(uchar *)&msg,
                                                             (uchar *)&msg,(uchar *)0x0,(void *)0x0,
                                                             0);
                                                  keyj.x.n[0] = 0x4d430005;
                                                  keyj.x.n[2] = 0x20;
                                                  keyj.x.n[3] = 0;
                                                  keyj.x.n[4] = 0;
                                                  keyj.x.magnitude = 0;
                                                  keyj.x.normalized = 0;
                                                  __calls_to_callback_9 = 0;
                                                  keyj.x.n[1] = (uint64_t)&sr;
                                                  nonce_function_rfc6979
                                                            ((uchar *)&ss,(uchar *)&msg,
                                                             (uchar *)&msg,(uchar *)&msg,(void *)0x0
                                                             ,0);
                                                  keyj.x.n[0] = 0x4d430005;
                                                  keyj.x.n[2] = 0x20;
                                                  keyj.x.n[3] = 0;
                                                  keyj.x.n[4] = 0;
                                                  keyj.x.magnitude = 0;
                                                  keyj.x.normalized = 0;
                                                  __calls_to_callback_9 = 0;
                                                  keyj.x.n[1] = (uint64_t)&ss;
                                                  nonce_function_rfc6979
                                                            ((uchar *)&ss_3,(uchar *)&msg,
                                                             (uchar *)&msg,(uchar *)0x0,&msg,0);
                                                  keyj.x.n[0] = 0x4d430005;
                                                  keyj.x.n[2] = 0x20;
                                                  keyj.x.n[3] = 0;
                                                  keyj.x.n[4] = 0;
                                                  keyj.x.magnitude = 0;
                                                  keyj.x.normalized = 0;
                                                  __calls_to_callback_9 = 0;
                                                  keyj.x.n[1] = (uint64_t)&ss_3;
                                                  nonce_function_rfc6979
                                                            ((uchar *)&siglen,(uchar *)&msg,
                                                             (uchar *)&msg,(uchar *)&msg,&msg,0);
                                                  keyj.x.n[0] = 0x4d430005;
                                                  keyj.x.n[2] = 0x20;
                                                  keyj.x.n[3] = 0;
                                                  keyj.x.n[4] = 0;
                                                  keyj.x.magnitude = 0;
                                                  keyj.x.normalized = 0;
                                                  __calls_to_callback_9 = 0;
                                                  keyj.x.n[1] = (uint64_t)&siglen;
                                                  iVar7 = secp256k1_memcmp_var(&sr,&ss,0x20);
                                                  if (iVar7 == 0) {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce, nonce2, 32) != 0"
                                                  ;
                                                  uVar9 = 0x1cc7;
                                                  }
                                                  else {
                                                    iVar7 = secp256k1_memcmp_var(&sr,&ss_3,0x20);
                                                    if (iVar7 == 0) {
                                                      pcVar12 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce, nonce3, 32) != 0"
                                                  ;
                                                  uVar9 = 0x1cc8;
                                                  }
                                                  else {
                                                    iVar7 = secp256k1_memcmp_var(&sr,&siglen,0x20);
                                                    if (iVar7 == 0) {
                                                      pcVar12 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce, nonce4, 32) != 0"
                                                  ;
                                                  uVar9 = 0x1cc9;
                                                  }
                                                  else {
                                                    iVar7 = secp256k1_memcmp_var(&ss,&ss_3,0x20);
                                                    if (iVar7 == 0) {
                                                      pcVar12 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce2, nonce3, 32) != 0"
                                                  ;
                                                  uVar9 = 0x1cca;
                                                  }
                                                  else {
                                                    iVar7 = secp256k1_memcmp_var(&ss,&siglen,0x20);
                                                    if (iVar7 == 0) {
                                                      pcVar12 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce2, nonce4, 32) != 0"
                                                  ;
                                                  uVar9 = 0x1ccb;
                                                  }
                                                  else {
                                                    iVar7 = secp256k1_memcmp_var(&ss_3,&siglen,0x20)
                                                    ;
                                                    if (iVar7 == 0) {
                                                      pcVar12 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce3, nonce4, 32) != 0"
                                                  ;
                                                  uVar9 = 0x1ccc;
                                                  }
                                                  else {
                                                    msg.d[3]._0_1_ = 0xbf;
                                                    msg.d[3]._1_1_ = 0xd2;
                                                    msg.d[3]._2_1_ = '^';
                                                    msg.d[3]._3_1_ = 0x8c;
                                                    msg.d[3]._4_1_ = 0xd0;
                                                    msg.d[3]._5_1_ = '6';
                                                    msg.d[3]._6_1_ = 'A';
                                                    msg.d[3]._7_1_ = 'A';
                                                    msg.d[2]._0_1_ = 0xba;
                                                    msg.d[2]._1_1_ = 0xae;
                                                    msg.d[2]._2_1_ = 0xdc;
                                                    msg.d[2]._3_1_ = 0xe6;
                                                    msg.d[2]._4_1_ = 0xaf;
                                                    msg.d[2]._5_1_ = 'H';
                                                    msg.d[2]._6_1_ = 0xa0;
                                                    msg.d[2]._7_1_ = ';';
                                                    msg.d[1]._0_1_ = 0xff;
                                                    msg.d[1]._1_1_ = 0xff;
                                                    msg.d[1]._2_1_ = 0xff;
                                                    msg.d[1]._3_1_ = 0xff;
                                                    msg.d[1]._4_1_ = 0xff;
                                                    msg.d[1]._5_1_ = 0xff;
                                                    msg.d[1]._6_1_ = 0xff;
                                                    msg.d[1]._7_1_ = 0xfe;
                                                    msg.d[0]._0_1_ = 0xff;
                                                    msg.d[0]._1_1_ = 0xff;
                                                    msg.d[0]._2_1_ = 0xff;
                                                    msg.d[0]._3_1_ = 0xff;
                                                    msg.d[0]._4_1_ = 0xff;
                                                    msg.d[0]._5_1_ = 0xff;
                                                    msg.d[0]._6_1_ = 0xff;
                                                    msg.d[0]._7_1_ = 0xff;
                                                    iVar7 = ec_privkey_export_der
                                                                      (CTX,(uchar *)&keyj,sr.d,
                                                                       (uchar *)&msg,0);
                                                    if (iVar7 == 0) {
                                                      iVar7 = ec_privkey_export_der
                                                                        (CTX,(uchar *)&keyj,sr.d,
                                                                         (uchar *)&msg,1);
                                                      if (iVar7 == 0) {
                                                        return;
                                                      }
                                                      pcVar12 = 
                                                  "test condition failed: !ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1)"
                                                  ;
                                                  uVar9 = 0x1cdc;
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: !ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0)"
                                                  ;
                                                  uVar9 = 0x1cda;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0"
                                                  ;
                                                  uVar9 = 0x1c74;
                                                  }
                                                  }
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_parse_compact(CTX, &sig, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c71;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_parse_compact(CTX, ((void*)0), signature)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c70;
                                                  }
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_serialize_compact(CTX, signature, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c6e;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_serialize_compact(CTX, ((void*)0), &sig)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c6d;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_normalize(CTX, ((void*)0), ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c6c;
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0"
                                                  ;
                                                  uVar9 = 0x1c6b;
                                                  }
                                                  }
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_parse_der(CTX, &sig, ((void*)0), siglen)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c67;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_parse_der(CTX, ((void*)0), signature, siglen)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c66;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c64;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_serialize_der(CTX, signature, ((void*)0), &sig)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c63;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_serialize_der(CTX, ((void*)0), &siglen, &sig)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c62;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c60;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ec_pubkey_create(CTX, &pubkey, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c5e;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_verify(CTX, &sig, msg, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c5c;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_verify(CTX, &sig, ((void*)0), &pubkey)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c5b;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_verify(CTX, ((void*)0), msg, &pubkey)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c5a;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1"
                                                  ;
                                                  uVar9 = 0x1c58;
                                                  }
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_sign(CTX, &sig, msg, ((void*)0), precomputed_nonce_function, nonce2)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c57;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_sign(CTX, &sig, ((void*)0), key, precomputed_nonce_function, nonce2)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c56;
                                                  goto LAB_0013b1a6;
                                                  }
                                                  pcVar12 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: (secp256k1_ecdsa_sign(CTX, ((void*)0), msg, key, precomputed_nonce_function, nonce2)) == 0"
                                                  ;
                                                  }
                                                  uVar9 = 0x1c55;
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1"
                                                  ;
                                                  uVar9 = 0x1c54;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0"
                                                  ;
                                                  uVar9 = 0x1c52;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0"
                                                  ;
                                                  uVar9 = 0x1c51;
                                                  }
                                                  }
                                                  else {
                                                    pcVar12 = 
                                                  "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0"
                                                  ;
                                                  uVar9 = 0x1c31;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else {
                                            pcVar12 = 
                                            "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0"
                                            ;
                                            uVar9 = 0x1c12;
                                          }
                                        }
                                        else {
                                          pcVar12 = 
                                          "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0"
                                          ;
                                          uVar9 = 0x1c11;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          else {
                            pcVar12 = 
                            "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0"
                            ;
                            uVar9 = 0x1be8;
                          }
                        }
                        else {
                          pcVar12 = 
                          "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0"
                          ;
                          uVar9 = 0x1be7;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            pcVar12 = "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0"
            ;
            uVar9 = 0x1bc5;
          }
        }
      }
      else {
        pcVar12 = "test condition failed: secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0";
        uVar9 = 0x1bb2;
      }
    }
  }
  else {
    pcVar12 = "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0";
    uVar9 = 0x1b9f;
  }
LAB_0013b1a6:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar9,pcVar12);
  abort();
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, NULL));
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey));
        siglen = 72;
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen));
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL));
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}